

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ParsePrimMetas(AsciiParser *this,PrimMetaMap *args)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  ulong uVar3;
  bool bVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> m;
  ostringstream ss_e;
  string local_210;
  byte local_1f0;
  pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> local_1e8;
  optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> local_1a8;
  ios_base local_138 [264];
  
  bVar4 = Expect(this,'(');
  if ((bVar4) && (bVar4 = SkipCommentAndWhitespaceAndNewline(this,true), bVar4)) {
    do {
      pSVar2 = this->_sr;
      if (pSVar2->length_ <= pSVar2->idx_) {
        return true;
      }
      if (pSVar2->binary_[pSVar2->idx_] == '\0') {
        return true;
      }
      bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar4) {
        return false;
      }
      pSVar2 = this->_sr;
      uVar3 = pSVar2->idx_;
      if (pSVar2->length_ < uVar3 + 1) {
        return false;
      }
      uVar1 = pSVar2->binary_[uVar3];
      pSVar2->idx_ = uVar3 + 1;
      if (uVar1 == ')') {
        return true;
      }
      if (uVar3 <= pSVar2->length_ && -1 < (long)uVar3) {
        pSVar2->idx_ = uVar3;
      }
      ParsePrimMeta(&local_1a8,this);
      local_1f0 = local_1a8.has_value_;
      if (local_1a8.has_value_ == true) {
        ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::pair
                  (&local_1e8,
                   (pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)&local_1a8.contained);
      }
      if ((local_1a8.has_value_ & 1U) != 0) {
        nonstd::optional_lite::detail::
        storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::destruct_value
                  ((storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *)
                   &local_1a8.contained);
      }
      if (local_1f0 == 1) {
        if (local_1e8.second._name._M_string_length == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"ParsePrimMetas",0xe);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<(&local_1a8,0xc85);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          lVar7 = 0x29;
          pcVar8 = "[InternalError] Metadataum name is empty.";
          goto LAB_003319b8;
        }
        pmVar5 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                 ::operator[](args,(key_type *)&local_1e8.second._name);
        pmVar5->first = local_1e8.first;
        ::std::__cxx11::string::_M_assign((string *)&(pmVar5->second)._name);
        linb::any::operator=((any *)&pmVar5->second,(any *)&local_1e8.second);
        bVar4 = true;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"ParsePrimMetas",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(&local_1a8,0xc8a);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        lVar7 = 0x1b;
        pcVar8 = "Failed to parse Meta value.";
LAB_003319b8:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar8,lVar7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        ::std::ios_base::~ios_base(local_138);
        bVar4 = false;
      }
      if (local_1f0 == 1) {
        nonstd::optional_lite::detail::
        storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::destruct_value
                  ((storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *)
                   &local_1e8);
      }
    } while (bVar4);
  }
  return false;
}

Assistant:

bool AsciiParser::ParsePrimMetas(PrimMetaMap *args) {
  // '(' args ')'
  // args = list of argument, separated by newline.

  if (!Expect('(')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    // std::cout << "skip comment/whitespace/nl failed\n";
    DCOUT("SkipCommentAndWhitespaceAndNewline failed.");
    return false;
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      // std::cout << "2: skip comment/whitespace/nl failed\n";
      return false;
    }

    char s;
    if (!Char1(&s)) {
      return false;
    }

    if (s == ')') {
      DCOUT("Prim meta end");
      // End
      break;
    }

    Rewind(1);

    DCOUT("Start PrimMeta parse.");

    // ty = std::pair<ListEditQual, MetaVariable>;
    if (auto m = ParsePrimMeta()) {
      DCOUT("PrimMeta: list-edit qual = "
            << tinyusdz::to_string(std::get<0>(m.value()))
            << ", name = " << std::get<1>(m.value()).get_name());

      if (std::get<1>(m.value()).get_name().empty()) {
        PUSH_ERROR_AND_RETURN("[InternalError] Metadataum name is empty.");
      }

      (*args)[std::get<1>(m.value()).get_name()] = m.value();
    } else {
      PUSH_ERROR_AND_RETURN("Failed to parse Meta value.");
    }
  }

  return true;
}